

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

bool __thiscall spvtools::opt::Loop::IsLCSSA(Loop *this)

{
  IRContext *pIVar1;
  CFG *this_00;
  DefUseManager *this_01;
  Instruction *def;
  bool bVar2;
  Analysis AVar3;
  _Hash_node_base *p_Var4;
  BasicBlock *pBVar5;
  Instruction *insn;
  IRContext *this_02;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  pIVar1 = this->context_;
  AVar3 = pIVar1->valid_analyses_;
  this_02 = pIVar1;
  if ((AVar3 & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
    this_02 = this->context_;
    AVar3 = this_02->valid_analyses_;
  }
  this_00 = (pIVar1->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  if ((AVar3 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(this_02);
  }
  this_01 = (this_02->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  GetExitBlocks(this,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&local_68);
  p_Var4 = (this->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  bVar2 = true;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    pIVar1 = this->context_;
    do {
      pBVar5 = CFG::block(this_00,*(uint32_t *)&p_Var4[1]._M_nxt);
      for (def = (pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          def != &(pBVar5->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          def = (def->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_88._8_8_ = 0;
        local_88._M_unused._M_object = operator_new(0x18);
        *(_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          **)local_88._M_unused._0_8_ = &local_68;
        *(IRContext **)((long)local_88._M_unused._0_8_ + 8) = pIVar1;
        *(Loop **)((long)local_88._M_unused._0_8_ + 0x10) = this;
        local_70 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:440:15)>
                   ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:440:15)>
                   ::_M_manager;
        bVar2 = analysis::DefUseManager::WhileEachUser
                          (this_01,def,(function<bool_(spvtools::opt::Instruction_*)> *)&local_88);
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        if (!bVar2) {
          bVar2 = false;
          goto LAB_00241314;
        }
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
    bVar2 = true;
  }
LAB_00241314:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return bVar2;
}

Assistant:

bool Loop::IsLCSSA() const {
  CFG* cfg = context_->cfg();
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  std::unordered_set<uint32_t> exit_blocks;
  GetExitBlocks(&exit_blocks);

  // Declare ir_context so we can capture context_ in the below lambda
  IRContext* ir_context = context_;

  for (uint32_t bb_id : GetBlocks()) {
    for (Instruction& insn : *cfg->block(bb_id)) {
      // All uses must be either:
      //  - In the loop;
      //  - In an exit block and in a phi instruction.
      if (!def_use_mgr->WhileEachUser(
              &insn,
              [&exit_blocks, ir_context, this](Instruction* use) -> bool {
                BasicBlock* parent = ir_context->get_instr_block(use);
                assert(parent && "Invalid analysis");
                if (IsInsideLoop(parent)) return true;
                if (use->opcode() != spv::Op::OpPhi) return false;
                return exit_blocks.count(parent->id());
              }))
        return false;
    }
  }
  return true;
}